

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O2

CScript * __thiscall CScript::operator<<(CScript *this,CScriptNum *b)

{
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b_00;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CScriptNum::serialize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,&b->m_value);
  b_00._M_extent._M_extent_value =
       (long)local_30._M_impl.super__Vector_impl_data._M_finish -
       (long)local_30._M_impl.super__Vector_impl_data._M_start;
  b_00._M_ptr = local_30._M_impl.super__Vector_impl_data._M_start;
  operator<<(this,b_00);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

CScript& operator<<(const CScriptNum& b) LIFETIMEBOUND
    {
        *this << b.getvch();
        return *this;
    }